

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_CopyObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_HANDLE_PTR phNewObject)

{
  SessionObjectStore *this_00;
  HandleManager *this_01;
  P11Object *pPVar1;
  char cVar2;
  byte isPrivateObject;
  char extraout_AL;
  int iVar3;
  int iVar4;
  Session *this_02;
  Slot *this_03;
  Token *this_04;
  long *plVar5;
  CK_STATE CVar6;
  CK_RV CVar7;
  unsigned_long *puVar8;
  SessionObject *object;
  ByteString *pBVar9;
  size_t sVar10;
  _func_int **pp_Var11;
  CK_SLOT_ID CVar12;
  CK_OBJECT_HANDLE CVar13;
  CK_ULONG CVar14;
  byte isPrivateObject_00;
  bool bVar15;
  CK_RV CStack_1e0;
  CK_BBOOL local_1d3;
  long local_1c8;
  ByteString value;
  P11Object *newp11object;
  OSAttribute local_d0;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (phNewObject == (CK_OBJECT_HANDLE_PTR)0x0 || pTemplate == (CK_ATTRIBUTE_PTR)0x0) {
    return 7;
  }
  *phNewObject = 0;
  this_02 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_02 == (Session *)0x0) {
    return 0xb3;
  }
  this_03 = Session::getSlot(this_02);
  if (this_03 == (Slot *)0x0) {
    return 5;
  }
  this_04 = Session::getToken(this_02);
  if (this_04 == (Token *)0x0) {
    return 5;
  }
  plVar5 = (long *)HandleManager::getObject(this->handleManager,hObject);
  if (plVar5 == (long *)0x0) {
    return 0x82;
  }
  cVar2 = (**(code **)(*plVar5 + 0x50))(plVar5);
  if (cVar2 == '\0') {
    return 0x82;
  }
  local_1d3 = (**(code **)(*plVar5 + 0x20))(plVar5,1,0);
  isPrivateObject = (**(code **)(*plVar5 + 0x20))(plVar5,2,1);
  CVar6 = Session::getState(this_02);
  CVar7 = haveRead(CVar6,local_1d3,isPrivateObject);
  if (CVar7 == 0) {
    cVar2 = (**(code **)(*plVar5 + 0x20))(plVar5,0x171,1);
    if (cVar2 == '\0') {
      return 0x1b;
    }
    puVar8 = &pTemplate->ulValueLen;
    CVar14 = ulCount;
    isPrivateObject_00 = isPrivateObject;
    while (bVar15 = CVar14 != 0, CVar14 = CVar14 - 1, bVar15) {
      if (((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 2) {
        if (*puVar8 == 1) {
          isPrivateObject_00 = *(byte *)puVar8[-1];
        }
      }
      else if ((((_CK_ATTRIBUTE *)(puVar8 + -2))->type == 1) && (*puVar8 == 1)) {
        local_1d3 = *(CK_BBOOL *)puVar8[-1];
      }
      puVar8 = puVar8 + 3;
    }
    if (((isPrivateObject ^ 1) == 0) && (isPrivateObject_00 == 0)) {
      return 0xd1;
    }
    CVar6 = Session::getState(this_02);
    CVar7 = haveWrite(CVar6,local_1d3,isPrivateObject_00);
    if (CVar7 == 0) {
      if (local_1d3 == '\0') {
        this_00 = this->sessionObjectStore;
        CVar12 = Slot::getSlotID(this_03);
        object = SessionObjectStore::createObject(this_00,CVar12,hSession,isPrivateObject_00 != 0);
      }
      else {
        object = (SessionObject *)Token::createObject(this_04);
      }
      if (object == (SessionObject *)0x0) {
        return 5;
      }
      iVar3 = (*(object->super_OSObject)._vptr_OSObject[0xb])(object,1);
      if ((char)iVar3 == '\0') {
        CStack_1e0 = 6;
        pp_Var11 = (object->super_OSObject)._vptr_OSObject;
      }
      else {
        CStack_1e0 = 0;
        local_1c8 = 0;
        do {
          cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,local_1c8);
          if (cVar2 == '\0') {
            CStack_1e0 = 6;
            goto LAB_0013012f;
          }
          (**(code **)(*plVar5 + 0x18))((OSAttribute *)&newp11object,plVar5,local_1c8);
          if ((((isPrivateObject ^ 1) & isPrivateObject_00 != 0) == 0) ||
             (bVar15 = OSAttribute::isByteStringAttribute((OSAttribute *)&newp11object), !bVar15)) {
LAB_001300aa:
            iVar3 = (*(object->super_OSObject)._vptr_OSObject[8])
                              (object,local_1c8,(OSAttribute *)&newp11object);
            if ((char)iVar3 == '\0') {
              iVar3 = 5;
              CStack_1e0 = 6;
            }
            else {
LAB_001300c1:
              local_1c8 = (**(code **)(*plVar5 + 0x38))(plVar5,local_1c8);
              iVar3 = 0;
            }
          }
          else {
            pBVar9 = OSAttribute::getByteStringValue((OSAttribute *)&newp11object);
            sVar10 = ByteString::size(pBVar9);
            if (sVar10 == 0) goto LAB_001300aa;
            ByteString::ByteString(&value);
            pBVar9 = OSAttribute::getByteStringValue((OSAttribute *)&newp11object);
            Token::encrypt(this_04,(char *)pBVar9,(int)&value);
            if (extraout_AL == '\0') {
LAB_00130105:
              iVar3 = 5;
              bVar15 = true;
              CStack_1e0 = 6;
            }
            else {
              OSAttribute::OSAttribute(&local_d0,&value);
              iVar4 = (*(object->super_OSObject)._vptr_OSObject[8])(object,local_1c8,&local_d0);
              OSAttribute::~OSAttribute(&local_d0);
              iVar3 = 0;
              bVar15 = false;
              if ((char)iVar4 == '\0') goto LAB_00130105;
            }
            ByteString::~ByteString(&value);
            if (!bVar15) goto LAB_001300c1;
          }
          OSAttribute::~OSAttribute((OSAttribute *)&newp11object);
        } while ((iVar3 == 0) && (local_1c8 != 0));
        if (CStack_1e0 == 0) {
          iVar3 = (*(object->super_OSObject)._vptr_OSObject[0xc])();
          if ((char)iVar3 != '\0') {
            newp11object = (P11Object *)0x0;
            CStack_1e0 = newP11Object(&object->super_OSObject,&newp11object);
            pPVar1 = newp11object;
            if (CStack_1e0 == 0) {
              CStack_1e0 = P11Object::saveTemplate
                                     (newp11object,this_04,isPrivateObject_00 != 0,pTemplate,ulCount
                                      ,1);
              (*pPVar1->_vptr_P11Object[1])(pPVar1);
              if (CStack_1e0 == 0) {
                this_01 = this->handleManager;
                CVar12 = Slot::getSlotID(this_03);
                if (local_1d3 == '\0') {
                  CVar13 = HandleManager::addSessionObject
                                     (this_01,CVar12,hSession,isPrivateObject_00 != 0,object);
                }
                else {
                  CVar13 = HandleManager::addTokenObject
                                     (this_01,CVar12,isPrivateObject_00 != 0,object);
                }
                *phNewObject = CVar13;
                return 0;
              }
            }
            pp_Var11 = (object->super_OSObject)._vptr_OSObject;
            goto LAB_00130143;
          }
          CStack_1e0 = 6;
        }
        else {
LAB_0013012f:
          (*(object->super_OSObject)._vptr_OSObject[0xd])(object);
        }
        pp_Var11 = (object->super_OSObject)._vptr_OSObject;
      }
LAB_00130143:
      (*pp_Var11[0xe])(object);
      return CStack_1e0;
    }
    if (CVar7 == 0xb5) {
      softHSMLog(6,"C_CopyObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x67c,"Session is read-only");
      return 0xb5;
    }
    if (CVar7 != 0x101) {
      return CVar7;
    }
    iVar3 = 0x67a;
  }
  else {
    if (CVar7 != 0x101) {
      return CVar7;
    }
    iVar3 = 0x657;
  }
  softHSMLog(6,"C_CopyObject",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
             ,iVar3,"User is not authorized");
  return 0x101;
}

Assistant:

CK_RV SoftHSM::C_CopyObject(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phNewObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phNewObject == NULL_PTR) return CKR_ARGUMENTS_BAD;
	*phNewObject = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL wasOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL wasPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), wasOnToken, wasPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if the object is copyable
	CK_BBOOL isCopyable = object->getBooleanValue(CKA_COPYABLE, true);
	if (!isCopyable) return CKR_ACTION_PROHIBITED;

	// Extract critical information from the template
	CK_BBOOL isOnToken = wasOnToken;
	CK_BBOOL isPrivate = wasPrivate;

	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		if ((pTemplate[i].type == CKA_TOKEN) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
		if ((pTemplate[i].type == CKA_PRIVATE) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
	}

	// Check privacy does not downgrade
	if (wasPrivate && !isPrivate) return CKR_TEMPLATE_INCONSISTENT;

	// Check write user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Create the object in session or on the token
	OSObject *newobject = NULL_PTR;
	if (isOnToken)
	{
		newobject = (OSObject*) token->createObject();
	}
	else
	{
		newobject = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}
	if (newobject == NULL) return CKR_GENERAL_ERROR;

	// Copy attributes from object class (CKA_CLASS=0 so the first)
	if (!newobject->startTransaction())
	{
		newobject->destroyObject();
		return CKR_FUNCTION_FAILED;
	}

	CK_ATTRIBUTE_TYPE attrType = CKA_CLASS;
	do
	{
		if (!object->attributeExists(attrType))
		{
			rv = CKR_FUNCTION_FAILED;
			break;
		}

		OSAttribute attr = object->getAttribute(attrType);

		// Upgrade privacy has to encrypt byte strings
		if (!wasPrivate && isPrivate &&
		    attr.isByteStringAttribute() &&
		    attr.getByteStringValue().size() != 0)
		{
			ByteString value;
			if (!token->encrypt(attr.getByteStringValue(), value) ||
			    !newobject->setAttribute(attrType, value))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		else
		{
			if (!newobject->setAttribute(attrType, attr))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		attrType = object->nextAttributeType(attrType);
	}
	while (attrType != CKA_CLASS);

	if (rv != CKR_OK)
	{
		newobject->abortTransaction();
	}
	else if (!newobject->commitTransaction())
	{
		rv = CKR_FUNCTION_FAILED;
	}

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Get the new P11 object
	P11Object* newp11object = NULL;
	rv = newP11Object(newobject,&newp11object);
	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Apply the template
	rv = newp11object->saveTemplate(token, isPrivate != CK_FALSE, pTemplate, ulCount, OBJECT_OP_COPY);
	delete newp11object;

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Set handle
	if (isOnToken)
	{
		*phNewObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, newobject);
	}
	else
	{
		*phNewObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, newobject);
	}

	return CKR_OK;
}